

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolvmin.cpp
# Opt level: O3

bool __thiscall
chrono::ChOptimizerGenetic::DeletePopulation
          (ChOptimizerGenetic *this,ChGenotype ***my_population,int my_popsize)

{
  ChGenotype **ppCVar1;
  ChGenotype *pCVar2;
  double *pdVar3;
  ChGenotype **__ptr;
  ulong uVar4;
  
  ppCVar1 = *my_population;
  if (ppCVar1 != (ChGenotype **)0x0) {
    __ptr = ppCVar1;
    if (0 < my_popsize) {
      uVar4 = 0;
      do {
        pCVar2 = (*my_population)[uVar4];
        if ((pCVar2 != (ChGenotype *)0x0) &&
           (pdVar3 = (pCVar2->genes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data, pdVar3 != (double *)0x0)) {
          free((void *)pdVar3[-1]);
        }
        operator_delete(pCVar2,0x30);
        uVar4 = uVar4 + 1;
      } while ((uint)my_popsize != uVar4);
      __ptr = *my_population;
    }
    free(__ptr);
    *my_population = (ChGenotype **)0x0;
  }
  return ppCVar1 != (ChGenotype **)0x0;
}

Assistant:

bool ChOptimizerGenetic::DeletePopulation(ChGenotype**& my_population, int my_popsize) {
    if (my_population == NULL)
        return false;

    // delete all the individuals (the genotypes)
    ChGenotype* mygen;
    for (int i = 0; i < my_popsize; i++) {
        mygen = my_population[i];
        delete (mygen);
    }

    // delete the array of pointers
    free(my_population);
    my_population = NULL;

    return true;
}